

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileUplink(jx9_gen_state *pGen)

{
  SyToken *pEnd;
  SyToken *pSVar1;
  sxi32 sVar2;
  SyToken *pSVar3;
  SyToken *pNext;
  int local_3c;
  SyToken *local_38;
  
  local_38 = (SyToken *)0x0;
  pSVar3 = pGen->pIn;
  pEnd = pGen->pEnd;
  pSVar1 = pSVar3 + 1;
  pGen->pIn = pSVar1;
  if ((pSVar1 < pEnd) && ((pSVar3[1].nType & 0x40000) == 0)) {
    sVar2 = jx9GetNextExpr(pSVar1,pEnd,&local_38);
    if (sVar2 == 0) {
      local_3c = 0;
      do {
        pSVar3 = local_38;
        pSVar1 = pGen->pIn;
        if (pSVar1 < local_38) {
          pGen->pEnd = local_38;
          if ((pSVar1->nType & 0x10) == 0) {
            sVar2 = jx9GenCompileError(pGen,1,pSVar1->nLine,"uplink: Expected variable name");
            if (sVar2 == -10) {
              return -10;
            }
          }
          else {
            pGen->pIn = pSVar1 + 1;
            if (pSVar1 + 1 < local_38) {
              sVar2 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
              if (sVar2 != -3) {
                if (sVar2 == -10) {
                  return -10;
                }
                local_3c = local_3c + 1;
              }
            }
            else {
              jx9GenCompileError(pGen,2,pSVar1->nLine,"uplink: Empty variable name");
            }
          }
        }
        for (; (pSVar3 < pEnd && ((pSVar3->nType & 0x20000) != 0)); pSVar3 = pSVar3 + 1) {
        }
        pGen->pIn = pSVar3;
        sVar2 = jx9GetNextExpr(pSVar3,pEnd,&local_38);
      } while (sVar2 == 0);
      pGen->pEnd = pEnd;
      if (0 < local_3c) {
        jx9VmEmitInstr(pGen->pVm,0x40,local_3c,0,(void *)0x0,(sxu32 *)0x0);
      }
    }
    else {
      pGen->pEnd = pEnd;
    }
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileUplink(jx9_gen_state *pGen)
{
	SyToken *pTmp, *pNext = 0;
	sxi32 nExpr;
	sxi32 rc;
	/* Jump the 'uplink' keyword */
	pGen->pIn++;
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_SEMI) ){
		/* Nothing to process */
		return SXRET_OK;
	}
	pTmp = pGen->pEnd;
	nExpr = 0;
	while( SXRET_OK == jx9GetNextExpr(pGen->pIn, pTmp, &pNext) ){
		if( pGen->pIn < pNext ){
			pGen->pEnd = pNext;
			if( (pGen->pIn->nType & JX9_TK_DOLLAR) == 0 ){
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "uplink: Expected variable name");
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
			}else{
				pGen->pIn++;
				if( pGen->pIn >= pGen->pEnd ){
					/* Emit a warning */
					jx9GenCompileError(&(*pGen), E_WARNING, pGen->pIn[-1].nLine, "uplink: Empty variable name");
				}else{
					rc = jx9CompileExpr(&(*pGen), 0, 0);
					if( rc == SXERR_ABORT ){
						return SXERR_ABORT;
					}else if(rc != SXERR_EMPTY ){
						nExpr++;
					}
				}
			}
		}
		/* Next expression in the stream */
		pGen->pIn = pNext;
		/* Jump trailing commas */
		while( pGen->pIn < pTmp && (pGen->pIn->nType & JX9_TK_COMMA) ){
			pGen->pIn++;
		}
	}
	/* Restore token stream */
	pGen->pEnd = pTmp;
	if( nExpr > 0 ){
		/* Emit the uplink instruction */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_UPLINK, nExpr, 0, 0, 0);
	}
	return SXRET_OK;
}